

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecdsa_test.cc
# Opt level: O1

void __thiscall ECDSATest_MaxSigLen_Test::TestBody(ECDSATest_MaxSigLen_Test *this)

{
  void *pvVar1;
  ulong uVar2;
  int iVar3;
  BIGNUM *pBVar4;
  size_t __n;
  char *message;
  char *in_R9;
  long lVar5;
  bool bVar6;
  ScopedTrace gtest_trace_269;
  AssertionResult gtest_ar__1;
  uint8_t *der;
  size_t der_len;
  UniquePtr<ECDSA_SIG> sig;
  AssertionResult gtest_ar;
  vector<unsigned_char,_std::allocator<unsigned_char>_> bytes;
  size_t bits;
  ScopedTrace local_a9;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a0;
  AssertHelper local_98;
  AssertHelper local_90;
  _Head_base<0UL,_ecdsa_sig_st_*,_false> local_88;
  undefined1 local_80 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  AssertHelper local_60;
  undefined1 local_58 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_50;
  pointer local_48;
  AssertHelper local_40;
  ulong local_38;
  
  lVar5 = 0;
  do {
    local_38 = *(ulong *)((long)TestBody::kBits + lVar5);
    testing::ScopedTrace::ScopedTrace<unsigned_long>
              (&local_a9,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ecdsa/ecdsa_test.cc"
               ,0x10d,&local_38);
    uVar2 = local_38;
    local_88._M_head_impl = (ecdsa_sig_st *)ECDSA_SIG_new();
    local_58[0] = (internal)((ECDSA_SIG *)local_88._M_head_impl != (ECDSA_SIG *)0x0);
    local_50 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if ((ECDSA_SIG *)local_88._M_head_impl == (ECDSA_SIG *)0x0) {
      testing::Message::Message((Message *)&local_a8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_80,(internal *)local_58,(AssertionResult *)0x5c8620,"false","true",
                 in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_98,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ecdsa/ecdsa_test.cc"
                 ,0x112,(char *)CONCAT71(local_80._1_7_,local_80[0]));
      testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_a8);
      testing::internal::AssertHelper::~AssertHelper(&local_98);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_80._1_7_,local_80[0]) != &local_70) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_80._1_7_,local_80[0]),local_70._M_allocated_capacity + 1);
      }
      if (local_a8._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_a8._M_head_impl + 8))();
      }
      if (local_50 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_50,local_50);
      }
      goto LAB_003030ea;
    }
    __n = (ulong)(((uint)uVar2 & 7) + 7 >> 3) + (uVar2 >> 3);
    local_80[0] = (internal)0xff;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_58,__n,local_80,
               (allocator_type *)&local_a8);
    pBVar4 = BN_bin2bn((uchar *)CONCAT71(local_58._1_7_,local_58[0]),
                       (int)local_50 - (int)(uchar *)CONCAT71(local_58._1_7_,local_58[0]),
                       (BIGNUM *)(local_88._M_head_impl)->r);
    local_a8._M_head_impl._0_1_ = pBVar4 != (BIGNUM *)0x0;
    local_a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (pBVar4 == (BIGNUM *)0x0) {
      testing::Message::Message((Message *)&local_98);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_80,(internal *)&local_a8,
                 (AssertionResult *)"BN_bin2bn(bytes.data(), bytes.size(), sig->r)","false","true",
                 in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_90,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ecdsa/ecdsa_test.cc"
                 ,0x114,(char *)CONCAT71(local_80._1_7_,local_80[0]));
      testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_98);
LAB_00302ffe:
      testing::internal::AssertHelper::~AssertHelper(&local_90);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_80._1_7_,local_80[0]) != &local_70) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_80._1_7_,local_80[0]),local_70._M_allocated_capacity + 1);
      }
LAB_003030b4:
      if (local_98.data_ != (AssertHelperData *)0x0) {
        (**(code **)(*(long *)local_98.data_ + 8))();
      }
      if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_a0,local_a0);
      }
      pvVar1 = (void *)CONCAT71(local_58._1_7_,local_58[0]);
      if (pvVar1 != (void *)0x0) {
        operator_delete(pvVar1,(long)local_48 - (long)pvVar1);
      }
LAB_003030ea:
      std::unique_ptr<ecdsa_sig_st,_bssl::internal::Deleter>::~unique_ptr
                ((unique_ptr<ecdsa_sig_st,_bssl::internal::Deleter> *)&local_88);
      testing::ScopedTrace::~ScopedTrace(&local_a9);
      return;
    }
    pBVar4 = BN_bin2bn((uchar *)CONCAT71(local_58._1_7_,local_58[0]),
                       (int)local_50 - (int)(uchar *)CONCAT71(local_58._1_7_,local_58[0]),
                       (BIGNUM *)(local_88._M_head_impl)->s);
    local_a8._M_head_impl._0_1_ = pBVar4 != (BIGNUM *)0x0;
    local_a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (pBVar4 == (BIGNUM *)0x0) {
      testing::Message::Message((Message *)&local_98);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_80,(internal *)&local_a8,
                 (AssertionResult *)"BN_bin2bn(bytes.data(), bytes.size(), sig->s)","false","true",
                 in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_90,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ecdsa/ecdsa_test.cc"
                 ,0x115,(char *)CONCAT71(local_80._1_7_,local_80[0]));
      testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_98);
      goto LAB_00302ffe;
    }
    iVar3 = ECDSA_SIG_to_bytes((uint8_t **)&local_98,(size_t *)&local_90,local_88._M_head_impl);
    local_a8._M_head_impl._0_1_ = iVar3 != 0;
    local_a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar3 == 0) {
      testing::Message::Message((Message *)&local_60);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_80,(internal *)&local_a8,
                 (AssertionResult *)"ECDSA_SIG_to_bytes(&der, &der_len, sig.get())","false","true",
                 in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_40,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ecdsa/ecdsa_test.cc"
                 ,0x119,(char *)CONCAT71(local_80._1_7_,local_80[0]));
      testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_60);
      testing::internal::AssertHelper::~AssertHelper(&local_40);
      local_98.data_ = local_60.data_;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_80._1_7_,local_80[0]) != &local_70) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_80._1_7_,local_80[0]),local_70._M_allocated_capacity + 1);
        local_98.data_ = local_60.data_;
      }
      goto LAB_003030b4;
    }
    OPENSSL_free(local_98.data_);
    local_a8._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         ECDSA_SIG_max_len(__n);
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
              ((internal *)local_80,"der_len","ECDSA_SIG_max_len(order_len)",
               (unsigned_long *)&local_90,(unsigned_long *)&local_a8);
    if (local_80[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_a8);
      message = "";
      if (local_78 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        message = (local_78->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_60,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ecdsa/ecdsa_test.cc"
                 ,0x11c,message);
      testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_a8);
      testing::internal::AssertHelper::~AssertHelper(&local_60);
      if (local_a8._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_a8._M_head_impl + 8))();
      }
    }
    if (local_78 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_78,local_78);
    }
    pvVar1 = (void *)CONCAT71(local_58._1_7_,local_58[0]);
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1,(long)local_48 - (long)pvVar1);
    }
    std::unique_ptr<ecdsa_sig_st,_bssl::internal::Deleter>::~unique_ptr
              ((unique_ptr<ecdsa_sig_st,_bssl::internal::Deleter> *)&local_88);
    testing::ScopedTrace::~ScopedTrace(&local_a9);
    if (iVar3 == 0) {
      return;
    }
    bVar6 = lVar5 == 0x20;
    lVar5 = lVar5 + 8;
    if (bVar6) {
      return;
    }
  } while( true );
}

Assistant:

TEST(ECDSATest, MaxSigLen) {
  static const size_t kBits[] = {224, 256, 384, 521, 10000};
  for (size_t bits : kBits) {
    SCOPED_TRACE(bits);
    size_t order_len = BitsToBytes(bits);

    // Create the largest possible |ECDSA_SIG| of the given constraints.
    bssl::UniquePtr<ECDSA_SIG> sig(ECDSA_SIG_new());
    ASSERT_TRUE(sig);
    std::vector<uint8_t> bytes(order_len, 0xff);
    ASSERT_TRUE(BN_bin2bn(bytes.data(), bytes.size(), sig->r));
    ASSERT_TRUE(BN_bin2bn(bytes.data(), bytes.size(), sig->s));
    // Serialize it.
    uint8_t *der;
    size_t der_len;
    ASSERT_TRUE(ECDSA_SIG_to_bytes(&der, &der_len, sig.get()));
    OPENSSL_free(der);

    EXPECT_EQ(der_len, ECDSA_SIG_max_len(order_len));
  }
}